

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::TreeEnsembleRegressor::ByteSizeLong(TreeEnsembleRegressor *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->treeensemble_ == (TreeEnsembleParameters *)0x0 ||
      this == (TreeEnsembleRegressor *)&_TreeEnsembleRegressor_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = TreeEnsembleParameters::ByteSizeLong(this->treeensemble_);
    uVar3 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  uVar3 = this->postevaluationtransform_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar4 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar4 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar2 = sVar2 + uVar4;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t TreeEnsembleRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}